

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCString.h
# Opt level: O0

ostream * operator<<(ostream *ostr,gcstring *str)

{
  char *pcVar1;
  long *in_RSI;
  ostream *in_RDI;
  bad_alloc *anon_var_0;
  
  pcVar1 = (char *)(**(code **)(*in_RSI + 0x48))();
  std::operator<<(in_RDI,pcVar1);
  return in_RDI;
}

Assistant:

inline std::ostream & operator <<(std::ostream &ostr, const GENICAM_NAMESPACE::gcstring &str)
{
    try
    {
        // use formatted output operator of std::string
        ostr << str.c_str();
    }
    catch(std::bad_alloc &)
    {
        GENICAM_NAMESPACE::ThrowBadAlloc(__FILE__, __LINE__);
    }
    return ostr;
}